

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmListFileCache.h
# Opt level: O2

void __thiscall
BTs<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::BTs
          (BTs<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
           *this,basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *v,
          cmListFileBacktrace *bt)

{
  std::__cxx11::string::string((string *)this,(string *)v);
  (this->Backtraces).super__Vector_base<cmListFileBacktrace,_std::allocator<cmListFileBacktrace>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->Backtraces).super__Vector_base<cmListFileBacktrace,_std::allocator<cmListFileBacktrace>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->Backtraces).super__Vector_base<cmListFileBacktrace,_std::allocator<cmListFileBacktrace>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  std::vector<cmListFileBacktrace,_std::allocator<cmListFileBacktrace>_>::
  emplace_back<cmListFileBacktrace>(&this->Backtraces,bt);
  return;
}

Assistant:

BTs(T v = T(), cmListFileBacktrace bt = cmListFileBacktrace())
    : Value(std::move(v))
  {
    this->Backtraces.emplace_back(std::move(bt));
  }